

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool tinyexr::ConvertHeader(EXRHeader *exr_header,HeaderInfo *info,string *warn,string *err)

{
  long lVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  ostream *poVar5;
  size_type sVar6;
  void *pvVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  ulong local_210;
  size_t i;
  size_t c_2;
  size_t c_1;
  size_t c;
  stringstream local_1c0 [8];
  stringstream ss;
  ostream local_1b0 [383];
  byte local_31;
  string *psStack_30;
  bool valid;
  string *err_local;
  string *warn_local;
  HeaderInfo *info_local;
  EXRHeader *exr_header_local;
  
  exr_header->pixel_aspect_ratio = info->pixel_aspect_ratio;
  exr_header->screen_window_center[0] = info->screen_window_center[0];
  exr_header->screen_window_center[1] = info->screen_window_center[1];
  exr_header->screen_window_width = info->screen_window_width;
  exr_header->chunk_count = info->chunk_count;
  (exr_header->display_window).min_x = (info->display_window).min_x;
  (exr_header->display_window).min_y = (info->display_window).min_y;
  (exr_header->display_window).max_x = (info->display_window).max_x;
  (exr_header->display_window).max_y = (info->display_window).max_y;
  (exr_header->data_window).min_x = (info->data_window).min_x;
  (exr_header->data_window).min_y = (info->data_window).min_y;
  (exr_header->data_window).max_x = (info->data_window).max_x;
  (exr_header->data_window).max_y = (info->data_window).max_y;
  exr_header->line_order = info->line_order;
  exr_header->compression_type = info->compression_type;
  exr_header->tiled = info->tiled;
  exr_header->tile_size_x = info->tile_size_x;
  exr_header->tile_size_y = info->tile_size_y;
  exr_header->tile_level_mode = info->tile_level_mode;
  exr_header->tile_rounding_mode = info->tile_rounding_mode;
  psStack_30 = err;
  err_local = warn;
  warn_local = (string *)info;
  info_local = (HeaderInfo *)exr_header;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  EXRSetNameAttr(exr_header,pcVar3);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    local_31 = 1;
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &warn_local[5]._M_string_length,"scanlineimage");
    if (bVar2) {
      if ((info_local->data_window).max_x != 0) {
        if (psStack_30 != (string *)0x0) {
          std::__cxx11::string::operator+=
                    ((string *)psStack_30,
                     "(ConvertHeader) tiled bit must be off for `scanlineimage` type.\n");
        }
        local_31 = 0;
      }
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &warn_local[5]._M_string_length,"tiledimage");
      if (bVar2) {
        if ((info_local->data_window).max_x == 0) {
          if (psStack_30 != (string *)0x0) {
            std::__cxx11::string::operator+=
                      ((string *)psStack_30,
                       "(ConvertHeader) tiled bit must be on for `tiledimage` type.\n");
          }
          local_31 = 0;
        }
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&warn_local[5]._M_string_length,"deeptile");
        if (bVar2) {
          (info_local->display_window).max_y = 1;
          if ((info_local->data_window).max_x == 0) {
            if (psStack_30 != (string *)0x0) {
              std::__cxx11::string::operator+=
                        ((string *)psStack_30,
                         "(ConvertHeader) tiled bit must be on for `deeptile` type.\n");
            }
            local_31 = 0;
          }
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&warn_local[5]._M_string_length,"deepscanline");
          if (bVar2) {
            (info_local->display_window).max_y = 1;
            if (((info_local->data_window).max_x != 0) && (psStack_30 != (string *)0x0)) {
              std::__cxx11::string::operator+=
                        ((string *)psStack_30,
                         "(ConvertHeader) tiled bit must be off for `deepscanline` type.\n");
            }
          }
          else if (err_local != (string *)0x0) {
            std::__cxx11::stringstream::stringstream(local_1c0);
            poVar5 = std::operator<<(local_1b0,"(ConvertHeader) Unsupported or unknown info.type: ")
            ;
            poVar5 = std::operator<<(poVar5,(string *)&warn_local[5]._M_string_length);
            std::operator<<(poVar5,"\n");
            std::__cxx11::stringstream::str();
            std::__cxx11::string::operator+=((string *)err_local,(string *)&c);
            std::__cxx11::string::~string((string *)&c);
            std::__cxx11::stringstream::~stringstream(local_1c0);
          }
        }
      }
    }
    if ((local_31 & 1) == 0) {
      return false;
    }
  }
  sVar6 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::size
                    ((vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)
                     warn_local);
  info_local->tile_rounding_mode = (int)sVar6;
  pvVar7 = malloc((long)info_local->tile_rounding_mode * 0x110);
  *(void **)&info_local->tiled = pvVar7;
  for (c_1 = 0; c_1 < (ulong)(long)info_local->tile_rounding_mode; c_1 = c_1 + 1) {
    lVar1 = *(long *)&info_local->tiled;
    std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::operator[]
              ((vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)warn_local,
               c_1);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    strncpy((char *)(lVar1 + c_1 * 0x110),pcVar3,0xff);
    *(undefined1 *)(*(long *)&info_local->tiled + c_1 * 0x110 + 0xff) = 0;
    pvVar8 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::operator[]
                       ((vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)
                        warn_local,c_1);
    *(int *)(*(long *)&info_local->tiled + c_1 * 0x110 + 0x100) = pvVar8->pixel_type;
    pvVar8 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::operator[]
                       ((vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)
                        warn_local,c_1);
    *(uchar *)(*(long *)&info_local->tiled + c_1 * 0x110 + 0x10c) = pvVar8->p_linear;
    pvVar8 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::operator[]
                       ((vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)
                        warn_local,c_1);
    *(int *)(*(long *)&info_local->tiled + c_1 * 0x110 + 0x104) = pvVar8->x_sampling;
    pvVar8 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::operator[]
                       ((vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)
                        warn_local,c_1);
    *(int *)(*(long *)&info_local->tiled + c_1 * 0x110 + 0x108) = pvVar8->y_sampling;
  }
  pvVar7 = malloc((long)info_local->tile_rounding_mode << 2);
  *(void **)&info_local->tile_size_y = pvVar7;
  for (c_2 = 0; c_2 < (ulong)(long)info_local->tile_rounding_mode; c_2 = c_2 + 1) {
    pvVar8 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::operator[]
                       ((vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)
                        warn_local,c_2);
    *(int *)(*(long *)&info_local->tile_size_y + c_2 * 4) = pvVar8->pixel_type;
  }
  pvVar7 = malloc((long)info_local->tile_rounding_mode << 2);
  *(void **)&info_local->compression_type = pvVar7;
  for (i = 0; i < (ulong)(long)info_local->tile_rounding_mode; i = i + 1) {
    pvVar8 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::operator[]
                       ((vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)
                        warn_local,i);
    *(int *)(*(long *)&info_local->compression_type + i * 4) = pvVar8->pixel_type;
  }
  sVar6 = std::vector<TEXRAttribute,_std::allocator<TEXRAttribute>_>::size
                    ((vector<TEXRAttribute,_std::allocator<TEXRAttribute>_> *)
                     ((long)&warn_local->field_2 + 8));
  info_local->screen_window_width = (float)sVar6;
  if ((int)info_local->screen_window_width < 1) {
    info_local->pixel_aspect_ratio = 0.0;
    info_local->chunk_count = 0;
  }
  else {
    if (0x80 < (int)info_local->screen_window_width) {
      info_local->screen_window_width = 1.79366e-43;
    }
    pvVar7 = malloc((long)(int)info_local->screen_window_width * 0x210);
    *(void **)&info_local->pixel_aspect_ratio = pvVar7;
    for (local_210 = 0; local_210 < (ulong)(long)(int)info_local->screen_window_width;
        local_210 = local_210 + 1) {
      lVar1 = *(long *)&info_local->pixel_aspect_ratio;
      pvVar9 = std::vector<TEXRAttribute,_std::allocator<TEXRAttribute>_>::operator[]
                         ((vector<TEXRAttribute,_std::allocator<TEXRAttribute>_> *)
                          ((long)&warn_local->field_2 + 8),local_210);
      memcpy((void *)(lVar1 + local_210 * 0x210),pvVar9,0x100);
      lVar1 = *(long *)&info_local->pixel_aspect_ratio;
      pvVar9 = std::vector<TEXRAttribute,_std::allocator<TEXRAttribute>_>::operator[]
                         ((vector<TEXRAttribute,_std::allocator<TEXRAttribute>_> *)
                          ((long)&warn_local->field_2 + 8),local_210);
      memcpy((void *)(lVar1 + local_210 * 0x210 + 0x100),pvVar9->type,0x100);
      pvVar9 = std::vector<TEXRAttribute,_std::allocator<TEXRAttribute>_>::operator[]
                         ((vector<TEXRAttribute,_std::allocator<TEXRAttribute>_> *)
                          ((long)&warn_local->field_2 + 8),local_210);
      *(int *)(*(long *)&info_local->pixel_aspect_ratio + local_210 * 0x210 + 0x208) = pvVar9->size;
      pvVar9 = std::vector<TEXRAttribute,_std::allocator<TEXRAttribute>_>::operator[]
                         ((vector<TEXRAttribute,_std::allocator<TEXRAttribute>_> *)
                          ((long)&warn_local->field_2 + 8),local_210);
      *(uchar **)(*(long *)&info_local->pixel_aspect_ratio + local_210 * 0x210 + 0x200) =
           pvVar9->value;
    }
  }
  info_local->screen_window_center[1] = *(float *)((long)&warn_local[3].field_2 + 0xc);
  return true;
}

Assistant:

static bool ConvertHeader(EXRHeader *exr_header, const HeaderInfo &info, std::string *warn, std::string *err) {
  exr_header->pixel_aspect_ratio = info.pixel_aspect_ratio;
  exr_header->screen_window_center[0] = info.screen_window_center[0];
  exr_header->screen_window_center[1] = info.screen_window_center[1];
  exr_header->screen_window_width = info.screen_window_width;
  exr_header->chunk_count = info.chunk_count;
  exr_header->display_window.min_x = info.display_window.min_x;
  exr_header->display_window.min_y = info.display_window.min_y;
  exr_header->display_window.max_x = info.display_window.max_x;
  exr_header->display_window.max_y = info.display_window.max_y;
  exr_header->data_window.min_x = info.data_window.min_x;
  exr_header->data_window.min_y = info.data_window.min_y;
  exr_header->data_window.max_x = info.data_window.max_x;
  exr_header->data_window.max_y = info.data_window.max_y;
  exr_header->line_order = info.line_order;
  exr_header->compression_type = info.compression_type;
  exr_header->tiled = info.tiled;
  exr_header->tile_size_x = info.tile_size_x;
  exr_header->tile_size_y = info.tile_size_y;
  exr_header->tile_level_mode = info.tile_level_mode;
  exr_header->tile_rounding_mode = info.tile_rounding_mode;

  EXRSetNameAttr(exr_header, info.name.c_str());


  if (!info.type.empty()) {
    bool valid = true;
    if (info.type == "scanlineimage") {
      if (exr_header->tiled) {
        if (err) {
          (*err) += "(ConvertHeader) tiled bit must be off for `scanlineimage` type.\n";
        }
        valid = false;
      }
    } else if (info.type == "tiledimage") {
      if (!exr_header->tiled) {
        if (err) {
          (*err) += "(ConvertHeader) tiled bit must be on for `tiledimage` type.\n";
        }
        valid = false;
      }
    } else if (info.type == "deeptile") {
      exr_header->non_image = 1;
      if (!exr_header->tiled) {
        if (err) {
          (*err) += "(ConvertHeader) tiled bit must be on for `deeptile` type.\n";
        }
        valid = false;
      }
    } else if (info.type == "deepscanline") {
      exr_header->non_image = 1;
      if (exr_header->tiled) {
        if (err) {
          (*err) += "(ConvertHeader) tiled bit must be off for `deepscanline` type.\n";
        }
        //valid = false;
      }
    } else {
      if (warn) {
        std::stringstream ss;
        ss << "(ConvertHeader) Unsupported or unknown info.type: " << info.type << "\n";
        (*warn) += ss.str();
      }
    }

    if (!valid) {
      return false;
    }
  }

  exr_header->num_channels = static_cast<int>(info.channels.size());

  exr_header->channels = static_cast<EXRChannelInfo *>(malloc(
      sizeof(EXRChannelInfo) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
#ifdef _MSC_VER
    strncpy_s(exr_header->channels[c].name, info.channels[c].name.c_str(), 255);
#else
    strncpy(exr_header->channels[c].name, info.channels[c].name.c_str(), 255);
#endif
    // manually add '\0' for safety.
    exr_header->channels[c].name[255] = '\0';

    exr_header->channels[c].pixel_type = info.channels[c].pixel_type;
    exr_header->channels[c].p_linear = info.channels[c].p_linear;
    exr_header->channels[c].x_sampling = info.channels[c].x_sampling;
    exr_header->channels[c].y_sampling = info.channels[c].y_sampling;
  }

  exr_header->pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
    exr_header->pixel_types[c] = info.channels[c].pixel_type;
  }

  // Initially fill with values of `pixel_types`
  exr_header->requested_pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
    exr_header->requested_pixel_types[c] = info.channels[c].pixel_type;
  }

  exr_header->num_custom_attributes = static_cast<int>(info.attributes.size());

  if (exr_header->num_custom_attributes > 0) {
    // TODO(syoyo): Report warning when # of attributes exceeds
    // `TINYEXR_MAX_CUSTOM_ATTRIBUTES`
    if (exr_header->num_custom_attributes > TINYEXR_MAX_CUSTOM_ATTRIBUTES) {
      exr_header->num_custom_attributes = TINYEXR_MAX_CUSTOM_ATTRIBUTES;
    }

    exr_header->custom_attributes = static_cast<EXRAttribute *>(malloc(
        sizeof(EXRAttribute) * size_t(exr_header->num_custom_attributes)));

    for (size_t i = 0; i < size_t(exr_header->num_custom_attributes); i++) {
      memcpy(exr_header->custom_attributes[i].name, info.attributes[i].name,
             256);
      memcpy(exr_header->custom_attributes[i].type, info.attributes[i].type,
             256);
      exr_header->custom_attributes[i].size = info.attributes[i].size;
      // Just copy pointer
      exr_header->custom_attributes[i].value = info.attributes[i].value;
    }

  } else {
    exr_header->custom_attributes = NULL;
  }

  exr_header->header_len = info.header_len;

  return true;
}